

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

AliasRet aa_table(jit_State *J,IRRef ta,IRRef tb)

{
  IRIns *stop;
  IRIns *pIVar1;
  IRIns *pIVar2;
  AliasRet AVar3;
  byte bVar4;
  IRIns *pIVar5;
  byte bVar6;
  
  pIVar1 = (J->cur).ir;
  bVar4 = *(char *)((long)pIVar1 + (ulong)ta * 8 + 5) + 0xaf;
  bVar6 = *(char *)((long)pIVar1 + (ulong)tb * 8 + 5) + 0xaf;
  AVar3 = ALIAS_NO;
  if (1 < (bVar6 | bVar4)) {
    stop = pIVar1 + ta;
    if (bVar6 < 2) {
      AVar3 = aa_escape(J,pIVar1 + tb,stop);
      return AVar3;
    }
    if (bVar4 < 2) {
      pIVar5 = stop;
      do {
        pIVar2 = pIVar5;
        pIVar5 = pIVar2 + 1;
        if (pIVar1 + tb <= pIVar5) {
          return ALIAS_NO;
        }
      } while (((uint)*(ushort *)((long)pIVar2 + 10) !=
                (uint)((ulong)((long)stop - (long)(J->cur).ir) >> 3)) ||
              (3 < (byte)(*(char *)((long)pIVar2 + 0xd) + 0xb6U)));
      return ALIAS_MAY;
    }
    AVar3 = ALIAS_MAY;
  }
  return AVar3;
}

Assistant:

static AliasRet aa_table(jit_State *J, IRRef ta, IRRef tb)
{
  IRIns *taba = IR(ta), *tabb = IR(tb);
  int newa, newb;
  lj_assertJ(ta != tb, "bad usage");
  lj_assertJ(irt_istab(taba->t) && irt_istab(tabb->t), "bad usage");
  /* Disambiguate new allocations. */
  newa = (taba->o == IR_TNEW || taba->o == IR_TDUP);
  newb = (tabb->o == IR_TNEW || tabb->o == IR_TDUP);
  if (newa && newb)
    return ALIAS_NO;  /* Two different allocations never alias. */
  if (newb) {  /* At least one allocation? */
    IRIns *tmp = taba; taba = tabb; tabb = tmp;
  } else if (!newa) {
    return ALIAS_MAY;  /* Anything else: we just don't know. */
  }
  return aa_escape(J, taba, tabb);
}